

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QString * __thiscall QAccessibleMessageBox::text(QAccessibleMessageBox *this,Text t)

{
  long lVar1;
  bool bVar2;
  int in_EDX;
  QMessageBox *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *str;
  QString *this_00;
  Text in_stack_ffffffffffffff84;
  QAccessibleWidget *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x7f1bd2);
  if (in_EDX == 0) {
    QAccessibleWidget::text(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x7f1c35);
    bVar2 = QString::isEmpty((QString *)0x7f1c3e);
    if (bVar2) {
      messageBox((QAccessibleMessageBox *)0x7f1c4e);
      QMessageBox::text(in_RSI);
      QString::operator=(this_00,in_RDI);
      QString::~QString((QString *)0x7f1c7c);
    }
  }
  else if (in_EDX == 2) {
    messageBox((QAccessibleMessageBox *)0x7f1c8b);
    QMessageBox::text(in_RSI);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x7f1cb0);
  }
  else if (in_EDX == 3) {
    messageBox((QAccessibleMessageBox *)0x7f1cbc);
    QMessageBox::informativeText(in_RSI);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x7f1ce1);
  }
  else {
    QAccessibleWidget::text(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x7f1d0e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMessageBox::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        str = QAccessibleWidget::text(t);
        if (str.isEmpty()) // implies no title text is set
            str = messageBox()->text();
        break;
    case QAccessible::Value:
        str = messageBox()->text();
        break;
    case QAccessible::Help:
        str = messageBox()->informativeText();
        break;
    default:
        str = QAccessibleWidget::text(t);
        break;
    }

    return str;
}